

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O0

void * __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::getIndexPtr(PrimitiveRestartCase *this,int indexNdx)

{
  IndexType IVar1;
  int indexNdx_local;
  PrimitiveRestartCase *this_local;
  
  IVar1 = this->m_indexType;
  if (IVar1 == INDEX_UNSIGNED_BYTE) {
    this_local = (PrimitiveRestartCase *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->m_indicesUB,(long)indexNdx);
  }
  else if (IVar1 == INDEX_UNSIGNED_SHORT) {
    this_local = (PrimitiveRestartCase *)
                 std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (&this->m_indicesUS,(long)indexNdx);
  }
  else if (IVar1 == INDEX_UNSIGNED_INT) {
    this_local = (PrimitiveRestartCase *)
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->m_indicesUI,(long)indexNdx);
  }
  else {
    this_local = (PrimitiveRestartCase *)0x0;
  }
  return this_local;
}

Assistant:

void* PrimitiveRestartCase::getIndexPtr (int indexNdx)
{
	switch (m_indexType)
	{
		case INDEX_UNSIGNED_BYTE:	return (void*)&m_indicesUB[indexNdx];
		case INDEX_UNSIGNED_SHORT:	return (void*)&m_indicesUS[indexNdx];
		case INDEX_UNSIGNED_INT:	return (void*)&m_indicesUI[indexNdx];
		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}
}